

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int flow_set_drain(FLOW_HANDLE flow,_Bool drain_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  FLOW_INSTANCE *flow_instance;
  
  if (flow == (FLOW_HANDLE)0x0) {
    iVar2 = 0x19bf;
  }
  else {
    item_value = amqpvalue_create_boolean(drain_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x19c7;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(flow->composite_value,8,item_value);
      iVar2 = 0x19cd;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int flow_set_drain(FLOW_HANDLE flow, bool drain_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        AMQP_VALUE drain_amqp_value = amqpvalue_create_boolean(drain_value);
        if (drain_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(flow_instance->composite_value, 8, drain_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(drain_amqp_value);
        }
    }

    return result;
}